

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O3

void quantize3_ord_dither
               (j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,int num_rows)

{
  JDIMENSION JVar1;
  jpeg_color_quantizer *pjVar2;
  _func_void_j_decompress_ptr *p_Var3;
  long lVar4;
  long lVar5;
  long lVar6;
  _func_void_j_decompress_ptr *p_Var7;
  _func_void_j_decompress_ptr_boolean *p_Var8;
  JSAMPROW pJVar9;
  long lVar10;
  ulong uVar11;
  byte *pbVar12;
  long lVar13;
  uint local_5c;
  ulong local_58;
  
  if (0 < num_rows) {
    pjVar2 = cinfo->cquantize;
    p_Var3 = pjVar2[1].finish_pass;
    lVar4 = *(long *)p_Var3;
    lVar5 = *(long *)(p_Var3 + 8);
    lVar6 = *(long *)(p_Var3 + 0x10);
    JVar1 = cinfo->output_width;
    local_5c = *(uint *)((long)&pjVar2[2].color_quantize + 4);
    local_58 = 0;
    do {
      if (JVar1 != 0) {
        lVar13 = (long)(int)local_5c * 0x40;
        p_Var3 = pjVar2[2].finish_pass;
        p_Var7 = pjVar2[2].new_color_map;
        p_Var8 = pjVar2[3].start_pass;
        pJVar9 = output_buf[local_58];
        pbVar12 = input_buf[local_58];
        lVar10 = 0;
        uVar11 = 0;
        do {
          pJVar9[lVar10] =
               *(char *)(lVar5 + (long)*(int *)(p_Var7 + uVar11 * 4 + lVar13) + (ulong)pbVar12[1]) +
               *(char *)(lVar4 + (long)*(int *)(p_Var3 + uVar11 * 4 + lVar13) + (ulong)*pbVar12) +
               *(char *)(lVar6 + (long)*(int *)(p_Var8 + uVar11 * 4 + lVar13) + (ulong)pbVar12[2]);
          uVar11 = (ulong)((int)uVar11 + 1U & 0xf);
          lVar10 = lVar10 + 1;
          pbVar12 = pbVar12 + 3;
        } while (JVar1 != (JDIMENSION)lVar10);
      }
      local_5c = local_5c + 1 & 0xf;
      *(uint *)((long)&pjVar2[2].color_quantize + 4) = local_5c;
      local_58 = local_58 + 1;
    } while (local_58 != (uint)num_rows);
  }
  return;
}

Assistant:

METHODDEF(void)
quantize3_ord_dither (j_decompress_ptr cinfo, JSAMPARRAY input_buf,
		      JSAMPARRAY output_buf, int num_rows)
/* Fast path for out_color_components==3, with ordered dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  register int pixcode;
  register JSAMPROW input_ptr;
  register JSAMPROW output_ptr;
  JSAMPROW colorindex0 = cquantize->colorindex[0];
  JSAMPROW colorindex1 = cquantize->colorindex[1];
  JSAMPROW colorindex2 = cquantize->colorindex[2];
  int * dither0;		/* points to active row of dither matrix */
  int * dither1;
  int * dither2;
  int row_index, col_index;	/* current indexes into dither matrix */
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;

  for (row = 0; row < num_rows; row++) {
    row_index = cquantize->row_index;
    input_ptr = input_buf[row];
    output_ptr = output_buf[row];
    dither0 = cquantize->odither[0][row_index];
    dither1 = cquantize->odither[1][row_index];
    dither2 = cquantize->odither[2][row_index];
    col_index = 0;

    for (col = width; col > 0; col--) {
      pixcode  = GETJSAMPLE(colorindex0[GETJSAMPLE(*input_ptr++) +
					dither0[col_index]]);
      pixcode += GETJSAMPLE(colorindex1[GETJSAMPLE(*input_ptr++) +
					dither1[col_index]]);
      pixcode += GETJSAMPLE(colorindex2[GETJSAMPLE(*input_ptr++) +
					dither2[col_index]]);
      *output_ptr++ = (JSAMPLE) pixcode;
      col_index = (col_index + 1) & ODITHER_MASK;
    }
    row_index = (row_index + 1) & ODITHER_MASK;
    cquantize->row_index = row_index;
  }
}